

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadTableSection(BinaryReader *this,Offset section_size)

{
  Index IVar1;
  bool bVar2;
  Result RVar3;
  undefined1 local_58 [8];
  Limits elem_limits;
  Type elem_type;
  Index table_index;
  Index i;
  uint local_28;
  Enum local_24;
  Index num_tables;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_tables = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1c])(this->delegate_,section_size);
  bVar2 = Succeeded((Result)local_24);
  if (bVar2) {
    RVar3 = ReadCount(this,&local_28,"table count");
    bVar2 = Failed(RVar3);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1d])();
      bVar2 = Succeeded(RVar3);
      if (bVar2) {
        for (elem_type.type_index_ = 0; elem_type.type_index_ < local_28;
            elem_type.type_index_ = elem_type.type_index_ + 1) {
          IVar1 = this->num_table_imports_;
          Limits::Limits((Limits *)local_58);
          RVar3 = ReadTable(this,(Type *)&elem_limits.has_max,(Limits *)local_58);
          bVar2 = Failed(RVar3);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1e])
                                  (this->delegate_,(ulong)(IVar1 + elem_type.type_index_),
                                   elem_limits._16_8_,local_58);
          bVar2 = Succeeded(RVar3);
          if (!bVar2) {
            PrintError(this,"OnTable callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1f])();
        bVar2 = Succeeded(RVar3);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndTableSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnTableCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginTableSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadTableSection(Offset section_size) {
  CALLBACK(BeginTableSection, section_size);
  Index num_tables;
  CHECK_RESULT(ReadCount(&num_tables, "table count"));
  CALLBACK(OnTableCount, num_tables);
  for (Index i = 0; i < num_tables; ++i) {
    Index table_index = num_table_imports_ + i;
    Type elem_type;
    Limits elem_limits;
    CHECK_RESULT(ReadTable(&elem_type, &elem_limits));
    CALLBACK(OnTable, table_index, elem_type, &elem_limits);
  }
  CALLBACK0(EndTableSection);
  return Result::Ok;
}